

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

ssh_key * ecdsa_new_priv(ssh_keyalg *alg,ptrlen pub,ptrlen priv)

{
  ssh_key *psVar1;
  ssh_keyalg *psVar2;
  BinarySource src [1];
  BinarySource local_48;
  
  psVar1 = ecdsa_new_pub(alg,pub);
  if (psVar1 == (ssh_key *)0x0) {
    psVar1 = (ssh_key *)0x0;
  }
  else {
    local_48.pos = 0;
    local_48.err = BSE_NO_ERROR;
    local_48.data = priv.ptr;
    local_48.len = priv.len;
    local_48.binarysource_ = &local_48;
    psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2(&local_48);
    psVar1[-1].vt = psVar2;
  }
  return psVar1;
}

Assistant:

static ssh_key *ecdsa_new_priv(const ssh_keyalg *alg, ptrlen pub, ptrlen priv)
{
    ssh_key *sshk = ecdsa_new_pub(alg, pub);
    if (!sshk)
        return NULL;
    struct ecdsa_key *ek = container_of(sshk, struct ecdsa_key, sshk);

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, priv);
    ek->privateKey = get_mp_ssh2(src);

    return &ek->sshk;
}